

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

float * ma_dr_mp3__full_read_and_close_f32
                  (ma_dr_mp3 *pMP3,ma_dr_mp3_config *pConfig,ma_uint64 *pTotalFrameCount)

{
  _func_void_void_ptr_void_ptr *p_Var1;
  ulong framesToRead;
  ma_uint32 mVar2;
  ma_uint64 mVar3;
  ulong uVar4;
  float *pfVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  float temp [4096];
  float *local_4070;
  float local_4038 [4098];
  
  local_4070 = (float *)0x0;
  uVar6 = 0;
  uVar7 = 0;
  do {
    framesToRead = 0x1000 / (ulong)pMP3->channels;
    mVar3 = ma_dr_mp3_read_pcm_frames_f32(pMP3,framesToRead,local_4038);
    if (mVar3 == 0) {
      bVar9 = true;
    }
    else {
      uVar4 = mVar3 + uVar7;
      if (uVar6 < uVar4) {
        uVar8 = uVar6 * 2;
        if (uVar6 * 2 <= uVar4) {
          uVar8 = uVar4;
        }
        pfVar5 = (float *)ma_dr_mp3__realloc_from_callbacks
                                    (local_4070,uVar8 * pMP3->channels * 4,
                                     pMP3->channels * uVar6 * 4,&pMP3->allocationCallbacks);
        if (pfVar5 == (float *)0x0) {
          bVar9 = true;
          if ((local_4070 != (float *)0x0) &&
             (p_Var1 = (pMP3->allocationCallbacks).onFree,
             p_Var1 != (_func_void_void_ptr_void_ptr *)0x0)) {
            (*p_Var1)(local_4070,(pMP3->allocationCallbacks).pUserData);
          }
        }
        else {
          bVar9 = false;
          local_4070 = pfVar5;
          uVar6 = uVar8;
        }
        if (pfVar5 == (float *)0x0) goto LAB_0015cef1;
      }
      bVar9 = mVar3 != framesToRead;
      memcpy(local_4070 + uVar7 * pMP3->channels,local_4038,mVar3 * pMP3->channels * 4);
      uVar7 = uVar4;
    }
LAB_0015cef1:
    if (bVar9) {
      if (pConfig != (ma_dr_mp3_config *)0x0) {
        mVar2 = pMP3->sampleRate;
        pConfig->channels = pMP3->channels;
        pConfig->sampleRate = mVar2;
      }
      ma_dr_mp3_uninit(pMP3);
      if (pTotalFrameCount != (ma_uint64 *)0x0) {
        *pTotalFrameCount = uVar7;
      }
      return local_4070;
    }
  } while( true );
}

Assistant:

static float* ma_dr_mp3__full_read_and_close_f32(ma_dr_mp3* pMP3, ma_dr_mp3_config* pConfig, ma_uint64* pTotalFrameCount)
{
    ma_uint64 totalFramesRead = 0;
    ma_uint64 framesCapacity = 0;
    float* pFrames = NULL;
    float temp[4096];
    MA_DR_MP3_ASSERT(pMP3 != NULL);
    for (;;) {
        ma_uint64 framesToReadRightNow = MA_DR_MP3_COUNTOF(temp) / pMP3->channels;
        ma_uint64 framesJustRead = ma_dr_mp3_read_pcm_frames_f32(pMP3, framesToReadRightNow, temp);
        if (framesJustRead == 0) {
            break;
        }
        if (framesCapacity < totalFramesRead + framesJustRead) {
            ma_uint64 oldFramesBufferSize;
            ma_uint64 newFramesBufferSize;
            ma_uint64 newFramesCap;
            float* pNewFrames;
            newFramesCap = framesCapacity * 2;
            if (newFramesCap < totalFramesRead + framesJustRead) {
                newFramesCap = totalFramesRead + framesJustRead;
            }
            oldFramesBufferSize = framesCapacity * pMP3->channels * sizeof(float);
            newFramesBufferSize = newFramesCap   * pMP3->channels * sizeof(float);
            if (newFramesBufferSize > (ma_uint64)MA_SIZE_MAX) {
                break;
            }
            pNewFrames = (float*)ma_dr_mp3__realloc_from_callbacks(pFrames, (size_t)newFramesBufferSize, (size_t)oldFramesBufferSize, &pMP3->allocationCallbacks);
            if (pNewFrames == NULL) {
                ma_dr_mp3__free_from_callbacks(pFrames, &pMP3->allocationCallbacks);
                break;
            }
            pFrames = pNewFrames;
            framesCapacity = newFramesCap;
        }
        MA_DR_MP3_COPY_MEMORY(pFrames + totalFramesRead*pMP3->channels, temp, (size_t)(framesJustRead*pMP3->channels*sizeof(float)));
        totalFramesRead += framesJustRead;
        if (framesJustRead != framesToReadRightNow) {
            break;
        }
    }
    if (pConfig != NULL) {
        pConfig->channels   = pMP3->channels;
        pConfig->sampleRate = pMP3->sampleRate;
    }
    ma_dr_mp3_uninit(pMP3);
    if (pTotalFrameCount) {
        *pTotalFrameCount = totalFramesRead;
    }
    return pFrames;
}